

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloomFilterTest.cpp
# Opt level: O0

string * generateStringWithLength_abi_cxx11_(uint32_t length)

{
  int iVar1;
  uint in_ESI;
  string *in_RDI;
  uint32_t charIndex;
  uint32_t k;
  string *ret;
  result_type in_stack_ffffffffffffec28;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec30;
  uint local_13ac;
  random_device *in_stack_ffffffffffffec70;
  
  if ((generateStringWithLength[abi:cxx11](unsigned_int)::rnd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&generateStringWithLength[abi:cxx11](unsigned_int)::rnd),
     iVar1 != 0)) {
    std::random_device::random_device(in_stack_ffffffffffffec70);
    std::random_device::operator()((random_device *)0x2bee03);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine(in_stack_ffffffffffffec30,in_stack_ffffffffffffec28);
    std::random_device::~random_device((random_device *)0x2bee29);
    __cxa_guard_release(&generateStringWithLength[abi:cxx11](unsigned_int)::rnd);
  }
  std::__cxx11::string::string((string *)in_RDI);
  for (local_13ac = 0; local_13ac < in_ESI; local_13ac = local_13ac + 1) {
    in_stack_ffffffffffffec30 =
         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(in_stack_ffffffffffffec30);
    std::__cxx11::string::operator+=
              ((string *)in_RDI,
               "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
               [(uint)((int)in_stack_ffffffffffffec30 +
                      (int)((ulong)in_stack_ffffffffffffec30 / 0x3e) * -0x3e)]);
  }
  return in_RDI;
}

Assistant:

std::string generateStringWithLength(std::uint32_t length) {
    static std::mt19937 rnd(std::random_device{}());
    static const char charset[] =
        "0123456789"
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz";
    std::string ret;
    for (std::uint32_t k = 0; k < length; ++k) {
        auto charIndex = static_cast<std::uint32_t>(rnd() % (sizeof(charset) - 1));
        ret += charset[charIndex];
    }
    return ret;
}